

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetPolicyNode::Evaluate
          (string *__return_storage_ptr__,TargetPolicyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *psVar1;
  int iVar2;
  PolicyStatus PVar3;
  PolicyID PVar4;
  cmLocalGenerator *this_00;
  PolicyID id;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  string local_80;
  string *local_60;
  string local_58;
  GeneratorExpressionContent *local_38;
  
  if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_80,content);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "$<TARGET_POLICY:prop> may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target."
               ,"");
    reportError(context,&local_80,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_003c0d04;
  }
  else {
    context->HadContextSensitiveCondition = true;
    context->HadHeadSensitiveCondition = true;
    lVar7 = 1;
    local_60 = __return_storage_ptr__;
    local_38 = content;
    do {
      pcVar5 = targetPolicyWhitelist[lVar7];
      iVar2 = std::__cxx11::string::compare
                        ((char *)(parameters->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar2 == 0) {
        this_00 = cmGeneratorTarget::GetLocalGenerator(context->HeadTarget);
        PVar3 = statusForTarget(context->HeadTarget,pcVar5);
        switch(PVar3) {
        case WARN:
          PVar4 = policyForString(pcVar5);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_80,(cmPolicies *)(ulong)PVar4,id);
          cmLocalGenerator::IssueMessage(this_00,AUTHOR_WARNING,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        case OLD:
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
          pcVar6 = "0";
          pcVar5 = "";
          break;
        case NEW:
          (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
          pcVar6 = "1";
          pcVar5 = "";
          break;
        default:
          goto switchD_003c0c8c_default;
        }
        psVar1 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,pcVar6,pcVar5);
        return psVar1;
      }
switchD_003c0c8c_default:
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x18);
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_80,local_38);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "$<TARGET_POLICY:prop> may only be used with a limited number of policies.  Currently it may be used with the following policies:\n * CMP0003\n * CMP0004\n * CMP0008\n * CMP0020\n * CMP0021\n * CMP0022\n * CMP0027\n * CMP0037\n * CMP0038\n * CMP0041\n * CMP0042\n * CMP0046\n * CMP0052\n * CMP0060\n * CMP0063\n * CMP0065\n * CMP0068\n * CMP0069\n * CMP0073\n * CMP0076\n * CMP0081\n * CMP0083\n * CMP0095\n"
               ,"");
    reportError(context,&local_80,&local_58);
    __return_storage_ptr__ = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_003c0d04;
  }
  operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
LAB_003c0d04:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    if (!context->HeadTarget) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_POLICY:prop> may only be used with binary targets.  It "
        "may not be used with add_custom_command or add_custom_target.");
      return std::string();
    }

    context->HadContextSensitiveCondition = true;
    context->HadHeadSensitiveCondition = true;

    for (size_t i = 1; i < cm::size(targetPolicyWhitelist); ++i) {
      const char* policy = targetPolicyWhitelist[i];
      if (parameters.front() == policy) {
        cmLocalGenerator* lg = context->HeadTarget->GetLocalGenerator();
        switch (statusForTarget(context->HeadTarget, policy)) {
          case cmPolicies::WARN:
            lg->IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmPolicies::GetPolicyWarning(policyForString(policy)));
            CM_FALLTHROUGH;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::OLD:
            return "0";
          case cmPolicies::NEW:
            return "1";
        }
      }
    }
    reportError(
      context, content->GetOriginalExpression(),
      "$<TARGET_POLICY:prop> may only be used with a limited number of "
      "policies.  Currently it may be used with the following policies:\n"

#define STRINGIFY_HELPER(X) #X
#define STRINGIFY(X) STRINGIFY_HELPER(X)

#define TARGET_POLICY_LIST_ITEM(POLICY) " * " STRINGIFY(POLICY) "\n"

      CM_FOR_EACH_TARGET_POLICY(TARGET_POLICY_LIST_ITEM)

#undef TARGET_POLICY_LIST_ITEM
    );
    return std::string();
  }